

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmAndiEa<(moira::Instr)7,(moira::Mode)4,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  UInt u;
  Ea<(moira::Mode)4,_4> dst;
  u32 local_3c;
  ushort local_38;
  
  *addr = *addr + 2;
  iVar4 = (*this->_vptr_Moira[6])();
  *addr = *addr + 2;
  uVar5 = (*this->_vptr_Moira[6])(this);
  u.raw = uVar5 & 0xffff | iVar4 << 0x10;
  local_38 = op & 7;
  local_3c = *addr;
  if (str->style->syntax == MUSASHI) {
    cVar3 = 'a';
    lVar6 = 0;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar3;
      cVar3 = "andi"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    if (str->style->syntax - MOIRA_MIT < 3) {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = 'l';
    }
    else {
      cVar3 = '.';
      lVar6 = 0;
      do {
        pcVar2 = str->ptr;
        str->ptr = pcVar2 + 1;
        *pcVar2 = cVar3;
        cVar3 = "$%x.l"[lVar6 + 4];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 2);
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = ' ';
    }
    else {
      iVar4 = (str->tab).raw;
      do {
        pcVar2 = str->ptr;
        str->ptr = pcVar2 + 1;
        *pcVar2 = ' ';
      } while (str->ptr < str->base + iVar4);
    }
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = '#';
    StrWriter::operator<<(str,u);
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = ',';
    SVar1 = str->style->syntax;
    if ((MUSASHI < SVar1) || (cVar3 = ' ', (0x13U >> (SVar1 & 0x1f) & 1) == 0)) goto LAB_001e1197;
  }
  else {
    cVar3 = 'a';
    lVar6 = 0;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar3;
      cVar3 = "andi"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    if (str->style->syntax - MOIRA_MIT < 3) {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = 'l';
    }
    else {
      cVar3 = '.';
      lVar6 = 0;
      do {
        pcVar2 = str->ptr;
        str->ptr = pcVar2 + 1;
        *pcVar2 = cVar3;
        cVar3 = "$%x.l"[lVar6 + 4];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 2);
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = ' ';
    }
    else {
      iVar4 = (str->tab).raw;
      do {
        pcVar2 = str->ptr;
        str->ptr = pcVar2 + 1;
        *pcVar2 = ' ';
      } while (str->ptr < str->base + iVar4);
    }
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = '#';
    StrWriter::operator<<(str,(Int)u.raw);
    cVar3 = ',';
  }
  pcVar2 = str->ptr;
  str->ptr = pcVar2 + 1;
  *pcVar2 = cVar3;
LAB_001e1197:
  StrWriter::operator<<(str,(Ea<(moira::Mode)4,_4> *)&local_3c);
  return;
}

Assistant:

void
Moira::dasmAndiEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    if (str.style.syntax == Syntax::MUSASHI) {
        str << Ins<I>{} << Sz<S>{} << str.tab << Imu<S>{src} << Sep{} << dst;
    } else {
        str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>(src) << "," << dst;
    }
}